

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::LoopDependenceAnalysis::GetTripCount(LoopDependenceAnalysis *this,Loop *loop)

{
  Instruction *induction;
  BasicBlock *pBVar1;
  bool bVar2;
  Op condition;
  Instruction *branch_inst;
  SENode *pSVar3;
  undefined1 local_48 [16];
  size_t iteration_count;
  Instruction *cond_instr;
  Instruction *induction_instr;
  BasicBlock *condition_block;
  Loop *loop_local;
  LoopDependenceAnalysis *this_local;
  
  condition_block = (BasicBlock *)loop;
  loop_local = (Loop *)this;
  induction_instr = (Instruction *)Loop::FindConditionBlock(loop);
  if ((((BasicBlock *)induction_instr != (BasicBlock *)0x0) &&
      (cond_instr = Loop::FindConditionVariable
                              ((Loop *)condition_block,(BasicBlock *)induction_instr),
      cond_instr != (Instruction *)0x0)) &&
     (iteration_count = (size_t)Loop::GetConditionInst((Loop *)condition_block),
     pBVar1 = condition_block, (Instruction *)iteration_count != (Instruction *)0x0)) {
    local_48._8_8_ =
         (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          )0x0;
    condition = opt::Instruction::opcode((Instruction *)iteration_count);
    bVar2 = Loop::IsSupportedCondition((Loop *)pBVar1,condition);
    pBVar1 = condition_block;
    induction = cond_instr;
    if (bVar2) {
      BasicBlock::tail((BasicBlock *)local_48);
      branch_inst = utils::IntrusiveList<spvtools::opt::Instruction>::
                    iterator_template<spvtools::opt::Instruction>::operator*
                              ((iterator_template<spvtools::opt::Instruction> *)local_48);
      bVar2 = Loop::FindNumberOfIterations
                        ((Loop *)pBVar1,induction,branch_inst,(size_t *)(local_48 + 8),
                         (int64_t *)0x0,(int64_t *)0x0);
      if (bVar2) {
        pSVar3 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,local_48._8_8_);
        return pSVar3;
      }
    }
  }
  return (SENode *)0x0;
}

Assistant:

SENode* LoopDependenceAnalysis::GetTripCount(const Loop* loop) {
  BasicBlock* condition_block = loop->FindConditionBlock();
  if (!condition_block) {
    return nullptr;
  }
  Instruction* induction_instr = loop->FindConditionVariable(condition_block);
  if (!induction_instr) {
    return nullptr;
  }
  Instruction* cond_instr = loop->GetConditionInst();
  if (!cond_instr) {
    return nullptr;
  }

  size_t iteration_count = 0;

  // We have to check the instruction type here. If the condition instruction
  // isn't a supported type we can't calculate the trip count.
  if (loop->IsSupportedCondition(cond_instr->opcode())) {
    if (loop->FindNumberOfIterations(induction_instr, &*condition_block->tail(),
                                     &iteration_count)) {
      return scalar_evolution_.CreateConstant(
          static_cast<int64_t>(iteration_count));
    }
  }

  return nullptr;
}